

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

CommandSignature __thiscall
anon_unknown.dwarf_1352d2::ClangShellCommand::getSignature(ClangShellCommand *this)

{
  CommandSignature *pCVar1;
  CommandSignature local_10;
  
  local_10 = llbuild::buildsystem::ExternalCommand::getSignature(&this->super_ExternalCommand);
  pCVar1 = llbuild::basic::CommandSignature::combine<llvm::StringRef>(&local_10,&this->args);
  return (CommandSignature)pCVar1->value;
}

Assistant:

virtual CommandSignature getSignature() const override {
    return ExternalCommand::getSignature()
        .combine(args);
  }